

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O0

void putbyte(int offset,int data)

{
  int data_local;
  int offset_local;
  
  if ((bank < 0xf0) && (offset < 0x2000)) {
    rom[bank][offset] = (uchar)data;
    map[bank][offset] = (char)section + (char)(page << 5);
    if (max_bank < bank) {
      max_bank = bank;
    }
  }
  return;
}

Assistant:

void
putbyte(int offset, int data)
{
	if (bank >= RESERVED_BANK)
		return;
	if (offset < 0x2000) {
		rom[bank][offset] = (data) & 0xFF;
		map[bank][offset] = section + (page << 5);

		/* update rom size */
		if (bank > max_bank)
			max_bank = bank;
	}
}